

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c
# Opt level: O2

vec3 golf_json_object_get_vec3(JSON_Object *obj,char *name)

{
  double dVar1;
  double dVar2;
  JSON_Array *array;
  vec3 vVar3;
  
  array = json_object_get_array(obj,name);
  dVar1 = json_array_get_number(array,0);
  dVar2 = json_array_get_number(array,1);
  vVar3.x = (float)dVar1;
  vVar3.y = (float)dVar2;
  dVar1 = json_array_get_number(array,2);
  vVar3.z = (float)dVar1;
  return vVar3;
}

Assistant:

vec3 golf_json_object_get_vec3(JSON_Object *obj, const char *name) {
    JSON_Array *array = json_object_get_array(obj, name);
    vec3 v;
    v.x = (float)json_array_get_number(array, 0);
    v.y = (float)json_array_get_number(array, 1);
    v.z = (float)json_array_get_number(array, 2);
    return v;
}